

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cc
# Opt level: O2

int64_t rcg::getInteger(shared_ptr<GenApi_3_4::CNodeMapRef> *nodemap,char *name,int64_t *vmin,
                       int64_t *vmax,bool exception,bool igncache)

{
  element_type *peVar1;
  int iVar2;
  undefined4 extraout_var;
  long *plVar3;
  int64_t iVar4;
  int64_t iVar5;
  invalid_argument *piVar6;
  undefined3 in_register_00000081;
  allocator local_a5;
  undefined4 local_a4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80 [2];
  
  local_a4 = CONCAT31(in_register_00000081,exception);
  if (vmin != (int64_t *)0x0) {
    *vmin = 0;
  }
  if (vmax != (int64_t *)0x0) {
    *vmax = 0;
  }
  peVar1 = (nodemap->super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  GenICam_3_4::gcstring::gcstring((gcstring *)local_80,name);
  iVar2 = (*(peVar1->super_CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>).
            super_CGeneric_XMLLoaderParams._vptr_CGeneric_XMLLoaderParams[7])(peVar1,local_80);
  plVar3 = (long *)CONCAT44(extraout_var,iVar2);
  GenICam_3_4::gcstring::~gcstring((gcstring *)local_80);
  if (plVar3 == (long *)0x0) {
    if ((char)local_a4 != '\0') {
      piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string((string *)&local_a0,"Feature not found: ",&local_a5);
      std::operator+(local_80,&local_a0,name);
      std::invalid_argument::invalid_argument(piVar6,(string *)local_80);
      __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  else {
    iVar2 = (*(code *)**(undefined8 **)((long)plVar3 + *(long *)(*plVar3 + -0x28)))
                      ((long)plVar3 + *(long *)(*plVar3 + -0x28));
    if (iVar2 - 3U < 2) {
      iVar2 = (**(code **)(*plVar3 + 0xf0))(plVar3);
      if (iVar2 == 9) {
        plVar3 = (long *)__dynamic_cast(plVar3,&GenApi_3_4::INode::typeinfo,
                                        &GenApi_3_4::IEnumeration::typeinfo,0xfffffffffffffffe);
        plVar3 = (long *)(**(code **)(*plVar3 + 0x78))(plVar3,0,igncache);
        iVar4 = (**(code **)(*plVar3 + 0x38))(plVar3);
        if (vmin != (int64_t *)0x0) {
          *vmin = iVar4;
        }
        if (vmax == (int64_t *)0x0) {
          return iVar4;
        }
        *vmax = iVar4;
        return iVar4;
      }
      plVar3 = (long *)__dynamic_cast(plVar3,&GenApi_3_4::INode::typeinfo,
                                      &GenApi_3_4::IInteger::typeinfo,0xfffffffffffffffe);
      if (plVar3 != (long *)0x0) {
        iVar4 = (**(code **)(*plVar3 + 0x48))(plVar3,0,igncache);
        if (vmin != (int64_t *)0x0) {
          iVar5 = (**(code **)(*plVar3 + 0x60))(plVar3);
          *vmin = iVar5;
        }
        if (vmax == (int64_t *)0x0) {
          return iVar4;
        }
        iVar5 = (**(code **)(*plVar3 + 0x68))(plVar3);
        *vmax = iVar5;
        return iVar4;
      }
      if ((char)local_a4 != '\0') {
        piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string((string *)&local_a0,"Feature not integer: ",&local_a5);
        std::operator+(local_80,&local_a0,name);
        std::invalid_argument::invalid_argument(piVar6,(string *)local_80);
        __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
    }
    else if ((char)local_a4 != '\0') {
      piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string((string *)&local_a0,"Feature not readable: ",&local_a5);
      std::operator+(local_80,&local_a0,name);
      std::invalid_argument::invalid_argument(piVar6,(string *)local_80);
      __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  return 0;
}

Assistant:

int64_t getInteger(const std::shared_ptr<GenApi::CNodeMapRef> &nodemap, const char *name,
                   int64_t *vmin, int64_t *vmax, bool exception, bool igncache)
{
  int64_t ret=0;

  if (vmin != 0) *vmin=0;
  if (vmax != 0) *vmax=0;

  try
  {
    GenApi::INode *node=nodemap->_GetNode(name);

    if (node != 0)
    {
      if (GenApi::IsReadable(node))
      {
        if (node->GetPrincipalInterfaceType() == GenApi::intfIEnumeration)
        {
          GenApi::IEnumeration *p=dynamic_cast<GenApi::IEnumeration *>(node);
          ret=p->GetCurrentEntry(false, igncache)->GetValue();

          if (vmin != 0) *vmin=ret;
          if (vmax != 0) *vmax=ret;
        }
        else
        {
          GenApi::IInteger *val=dynamic_cast<GenApi::IInteger *>(node);

          if (val != 0)
          {
            ret=val->GetValue(false, igncache);

            if (vmin != 0) *vmin=val->GetMin();
            if (vmax != 0) *vmax=val->GetMax();
          }
          else if (exception)
          {
            throw std::invalid_argument(std::string("Feature not integer: ")+name);
          }
        }
      }
      else if (exception)
      {
        throw std::invalid_argument(std::string("Feature not readable: ")+name);
      }
    }
    else if (exception)
    {
      throw std::invalid_argument(std::string("Feature not found: ")+name);
    }
  }
  catch (const GENICAM_NAMESPACE::GenericException &ex)
  {
    if (exception)
    {
      throw std::invalid_argument(ex.what());
    }
  }

  return ret;
}